

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::InternalSwap
          (FieldDescriptorProto *this,FieldDescriptorProto *other)

{
  InternalMetadataWithArena *this_00;
  FieldDescriptorProto *other_local;
  FieldDescriptorProto *this_local;
  Container *local_30;
  
  std::swap<std::__cxx11::string*>(&(this->name_).ptr_,&(other->name_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->extendee_).ptr_,&(other->extendee_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->type_name_).ptr_,&(other->type_name_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->default_value_).ptr_,&(other->default_value_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->json_name_).ptr_,&(other->json_name_).ptr_);
  std::swap<google::protobuf::FieldOptions*>(&this->options_,&other->options_);
  std::swap<int>(&this->number_,&other->number_);
  std::swap<int>(&this->oneof_index_,&other->oneof_index_);
  std::swap<int>(&this->label_,&other->label_);
  std::swap<int>(&this->type_,&other->type_);
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  this_00 = &other->_internal_metadata_;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) != 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) != 1) goto LAB_00520c8d;
  }
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                           *)this_00);
  }
  else {
    local_30 = (Container *)
               internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,&local_30->unknown_fields);
LAB_00520c8d:
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void FieldDescriptorProto::InternalSwap(FieldDescriptorProto* other) {
  name_.Swap(&other->name_);
  extendee_.Swap(&other->extendee_);
  type_name_.Swap(&other->type_name_);
  default_value_.Swap(&other->default_value_);
  json_name_.Swap(&other->json_name_);
  std::swap(options_, other->options_);
  std::swap(number_, other->number_);
  std::swap(oneof_index_, other->oneof_index_);
  std::swap(label_, other->label_);
  std::swap(type_, other->type_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}